

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i64_Store16(w3Interp *this)

{
  pointer *ppwVar1;
  undefined2 uVar2;
  Value *pVVar3;
  undefined2 *puVar4;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_i64);
  uVar2 = *(undefined2 *)pVVar3;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  puVar4 = (undefined2 *)LoadStore(this,2);
  *puVar4 = uVar2;
  return;
}

Assistant:

INTERP (i64_Store16)
{
    const uint64_t a = pop_u64 ();
    *(uint16_t*)LoadStore (2) = (uint16_t)(a & 0xFFFF);
}